

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O2

bool bssl::ssl_supports_version(SSL_HANDSHAKE *hs,uint16_t version)

{
  bool bVar1;
  undefined8 in_RAX;
  uint16_t protocol_version;
  ushort local_12;
  
  local_12 = (ushort)((ulong)in_RAX >> 0x30);
  bVar1 = ssl_method_supports_version(hs->ssl->method,version);
  if (((bVar1) && (bVar1 = ssl_protocol_version_from_wire(&local_12,version), bVar1)) &&
     (hs->min_version <= local_12)) {
    return local_12 <= hs->max_version;
  }
  return false;
}

Assistant:

bool ssl_supports_version(const SSL_HANDSHAKE *hs, uint16_t version) {
  const SSL *const ssl = hs->ssl;
  uint16_t protocol_version;
  if (!ssl_method_supports_version(ssl->method, version) ||
      !ssl_protocol_version_from_wire(&protocol_version, version) ||
      hs->min_version > protocol_version ||
      protocol_version > hs->max_version) {
    return false;
  }

  return true;
}